

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_evsa.cpp
# Opt level: O3

void __thiscall
phoenix_evsa_t::phoenix_evsa_t
          (phoenix_evsa_t *this,kstream *p__io,kstruct *p__parent,phoenix_evsa_t *p__root)

{
  pointer *__ptr;
  
  (this->super_kstruct).m__io = p__io;
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__phoenix_evsa_t_00185120;
  (this->m__raw_body)._M_dataplus._M_p = (pointer)&(this->m__raw_body).field_2;
  (this->m__raw_body)._M_string_length = 0;
  (this->m__raw_body).field_2._M_local_buf[0] = '\0';
  (this->m__io__raw_body)._M_t.
  super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>._M_t.
  super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>.
  super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl = (kstream *)0x0;
  this->m__parent = p__parent;
  this->m__root = this;
  (this->m_body)._M_t.
  super___uniq_ptr_impl<phoenix_evsa_t::evsa_body_t,_std::default_delete<phoenix_evsa_t::evsa_body_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_phoenix_evsa_t::evsa_body_t_*,_std::default_delete<phoenix_evsa_t::evsa_body_t>_>
  .super__Head_base<0UL,_phoenix_evsa_t::evsa_body_t_*,_false>._M_head_impl = (evsa_body_t *)0x0;
  std::__uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::reset
            ((__uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)
             &this->m__io__raw_body,(pointer)0x0);
  _read(this);
  return;
}

Assistant:

phoenix_evsa_t::phoenix_evsa_t(kaitai::kstream* p__io, kaitai::kstruct* p__parent, phoenix_evsa_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = this; (void)p__root;
    m_body = nullptr;
    m__io__raw_body = nullptr;
    _read();
}